

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void Intra4Preds_SSE2(uint8_t *dst,uint8_t *top)

{
  ulong uVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined1 uVar7;
  unkuint10 Var8;
  uint8_t uVar9;
  uint uVar10;
  uint8_t *puVar11;
  long lVar12;
  int iVar13;
  uint8_t uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint uVar21;
  int L;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short sVar27;
  undefined4 uVar28;
  short sVar36;
  short sVar38;
  __m128i ABCD0;
  undefined1 auVar31 [16];
  short sVar33;
  undefined1 auVar32 [16];
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar45;
  undefined1 uVar47;
  undefined1 uVar49;
  undefined1 uVar51;
  undefined1 uVar52;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 uVar46;
  undefined1 uVar48;
  undefined1 uVar50;
  undefined1 auVar44 [16];
  __m128i ABCDEFGH;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 uVar55;
  undefined4 uVar57;
  undefined1 uVar61;
  undefined1 auVar58 [16];
  int iVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined5 uVar29;
  undefined6 uVar30;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar37;
  int iVar56;
  undefined1 auVar59 [16];
  undefined1 uVar60;
  undefined1 uVar66;
  undefined1 uVar67;
  
  uVar15 = 4;
  lVar12 = -5;
  while (lVar12 + 1 != 0) {
    uVar15 = uVar15 + top[lVar12 + 5] + (uint)top[lVar12];
    lVar12 = lVar12 + 1;
  }
  Fill_SSE2(dst + 0x600,uVar15 >> 3,4);
  puVar11 = dst + 0x604;
  uVar28 = *(undefined4 *)top;
  bVar3 = top[-1];
  for (lVar12 = -2; lVar12 != -6; lVar12 = lVar12 + -1) {
    auVar31 = pshuflw(ZEXT416((uint)top[lVar12] - (uint)bVar3),
                      ZEXT416((uint)top[lVar12] - (uint)bVar3),0);
    sVar27 = auVar31._0_2_ + (ushort)(byte)uVar28;
    sVar33 = auVar31._2_2_ + (ushort)(byte)((uint)uVar28 >> 8);
    sVar36 = auVar31._4_2_ + (ushort)(byte)((uint)uVar28 >> 0x10);
    sVar38 = auVar31._6_2_ + (ushort)(byte)((uint)uVar28 >> 0x18);
    *(uint *)puVar11 =
         CONCAT13((0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38),
                  CONCAT12((0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36),
                           CONCAT11((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33)
                                    ,(0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 -
                                     (0xff < sVar27))));
    puVar11 = puVar11 + 0x20;
  }
  uVar5 = *(undefined8 *)(top + -1);
  uVar1 = *(ulong *)(top + -1);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar1;
  auVar64._0_8_ = uVar1 >> 8;
  auVar64._8_8_ = 0;
  uVar15 = (uint)uVar5;
  auVar43._8_4_ = uVar15;
  auVar43._0_8_ = uVar5;
  auVar43._12_4_ = (int)((ulong)uVar5 >> 0x20);
  uVar66 = (undefined1)uVar1;
  auVar41[0] = pavgb(uVar66,(char)((ulong)uVar5 >> 0x10));
  uVar67 = (undefined1)(uVar1 >> 8);
  auVar41[1] = pavgb(uVar67,(char)((ulong)uVar5 >> 0x18));
  uVar55 = (undefined1)((ulong)uVar5 >> 0x20);
  uVar34 = (undefined1)(uVar1 >> 0x10);
  auVar41[2] = pavgb(uVar34,uVar55);
  uVar35 = (undefined1)(uVar1 >> 0x18);
  auVar41[3] = pavgb(uVar35,(char)((ulong)uVar5 >> 0x28));
  uVar37 = (undefined1)(uVar1 >> 0x20);
  auVar41[4] = pavgb(uVar37,(char)((ulong)uVar5 >> 0x30));
  uVar40 = (undefined1)(uVar1 >> 0x28);
  auVar41[5] = pavgb(uVar40,(char)((ulong)uVar5 >> 0x38));
  uVar46 = (undefined1)(uVar1 >> 0x30);
  uVar7 = (undefined1)(uVar1 >> 0x38);
  auVar41[6] = pavgb(uVar46,0);
  auVar41[7] = pavgb(uVar7,0);
  auVar41[8] = pavgb(0,0);
  auVar41[9] = pavgb(0,0);
  auVar41[10] = pavgb(0,0);
  auVar41[0xb] = pavgb(0,0);
  auVar41[0xc] = pavgb(0,0);
  auVar41[0xd] = pavgb(0,0);
  auVar41[0xe] = pavgb(0,0);
  auVar41[0xf] = pavgb(0,0);
  auVar31 = psubusb(auVar41,(auVar43 >> 0x50 ^ auVar31) & _DAT_001a4960);
  uVar39 = pavgb(auVar31[0],uVar67);
  uVar45 = pavgb(auVar31[1],uVar34);
  uVar47 = pavgb(auVar31[2],uVar35);
  uVar49 = pavgb(auVar31[3],uVar37);
  pavgb(auVar31[4],uVar40);
  pavgb(auVar31[5],uVar46);
  pavgb(auVar31[6],uVar7);
  pavgb(auVar31[7],0);
  pavgb(auVar31[8],0);
  pavgb(auVar31[9],0);
  pavgb(auVar31[10],0);
  pavgb(auVar31[0xb],0);
  pavgb(auVar31[0xc],0);
  pavgb(auVar31[0xd],0);
  pavgb(auVar31[0xe],0);
  pavgb(auVar31[0xf],0);
  for (lVar12 = 0; lVar12 != 0x80; lVar12 = lVar12 + 0x20) {
    *(uint *)(dst + lVar12 + 0x608) = CONCAT13(uVar49,CONCAT12(uVar47,CONCAT11(uVar45,uVar39)));
  }
  bVar3 = top[-2];
  uVar16 = (uint)bVar3;
  uVar17 = (uint)top[-3];
  uVar10 = (uint)top[-4];
  bVar4 = top[-5];
  uVar21 = uVar17 + (uVar15 & 0xff) + uVar16 * 2 + 2 >> 2;
  *(uint *)(dst + 0x60c) = uVar21 * 0x1010101;
  uVar22 = uVar10 + uVar16 + uVar17 * 2 + 2 >> 2;
  *(uint *)(dst + 0x62c) = uVar22 * 0x1010101;
  iVar13 = uVar17 + uVar10 * 2 + 2;
  *(uint *)(dst + 0x64c) = (iVar13 + (uint)bVar4 >> 2) * 0x1010101;
  uVar2 = *(undefined8 *)(top + -5);
  Var8 = CONCAT28((ushort)((ulong)uVar5 >> 0x20) & 0xff,uVar2);
  *(uint *)(dst + 0x66c) = (uVar10 + (uint)bVar4 * 3 + 2 >> 2) * 0x1010101;
  auVar31 = _DAT_001a4960;
  uVar45 = (undefined1)((ulong)uVar2 >> 0x10);
  auVar42[0] = pavgb(uVar45,(char)uVar2);
  uVar39 = (undefined1)((ulong)uVar2 >> 8);
  uVar47 = (undefined1)((ulong)uVar2 >> 0x18);
  auVar42[1] = pavgb(uVar47,uVar39);
  uVar49 = (undefined1)((ulong)uVar2 >> 0x20);
  auVar42[2] = pavgb(uVar49,uVar45);
  uVar48 = (undefined1)((ulong)uVar2 >> 0x28);
  auVar42[3] = pavgb(uVar48,uVar47);
  uVar50 = (undefined1)((ulong)uVar2 >> 0x30);
  auVar42[4] = pavgb(uVar50,uVar49);
  uVar51 = (undefined1)((ulong)uVar2 >> 0x38);
  auVar42[5] = pavgb(uVar51,uVar48);
  auVar42[6] = pavgb(uVar55,uVar50);
  auVar42[7] = pavgb(0,uVar51);
  auVar42[8] = pavgb(0,uVar55);
  auVar42[9] = pavgb(0,0);
  auVar42[10] = pavgb(0,0);
  auVar42[0xb] = pavgb(0,0);
  auVar42[0xc] = pavgb(0,0);
  auVar42[0xd] = pavgb(0,0);
  auVar42[0xe] = pavgb(0,0);
  auVar42[0xf] = pavgb(0,0);
  auVar53._10_6_ = 0;
  auVar53._0_10_ = Var8 >> 0x10 ^ Var8;
  auVar43 = psubusb(auVar42,auVar53 & _DAT_001a4960);
  uVar39 = pavgb(auVar43[0],uVar39);
  uVar45 = pavgb(auVar43[1],uVar45);
  uVar47 = pavgb(auVar43[2],uVar47);
  uVar49 = pavgb(auVar43[3],uVar49);
  uVar28 = CONCAT13(uVar49,CONCAT12(uVar47,CONCAT11(uVar45,uVar39)));
  uVar39 = pavgb(auVar43[4],uVar48);
  uVar29 = CONCAT14(uVar39,uVar28);
  uVar39 = pavgb(auVar43[5],uVar50);
  uVar30 = CONCAT15(uVar39,uVar29);
  uVar39 = pavgb(auVar43[6],uVar51);
  pavgb(auVar43[7],uVar55);
  pavgb(auVar43[8],0);
  pavgb(auVar43[9],0);
  pavgb(auVar43[10],0);
  pavgb(auVar43[0xb],0);
  pavgb(auVar43[0xc],0);
  pavgb(auVar43[0xd],0);
  pavgb(auVar43[0xe],0);
  pavgb(auVar43[0xf],0);
  uVar55 = pavgb(uVar66,uVar67);
  uVar45 = pavgb(uVar67,uVar34);
  uVar47 = pavgb(uVar34,uVar35);
  uVar49 = pavgb(uVar35,uVar37);
  iVar56 = CONCAT13(uVar49,CONCAT12(uVar47,CONCAT11(uVar45,uVar55)));
  pavgb(uVar37,uVar40);
  pavgb(uVar40,uVar46);
  pavgb(uVar46,uVar7);
  pavgb(uVar7,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  uVar6 = uVar1 & 0xffffffffffff00;
  auVar58._8_8_ = uVar1 >> 0x38;
  auVar58._0_8_ = uVar6 << 8 | (ulong)(ushort)((ushort)(uVar15 << 8) | (ushort)bVar3);
  auVar63[0] = pavgb(bVar3,uVar67);
  auVar63[1] = pavgb((char)uVar5,uVar34);
  auVar63[2] = pavgb((char)(uVar6 >> 8),uVar35);
  auVar63[3] = pavgb((char)(uVar6 >> 0x10),uVar37);
  auVar63[4] = pavgb((char)(uVar6 >> 0x18),uVar40);
  auVar63[5] = pavgb((char)(uVar6 >> 0x20),uVar46);
  auVar63[6] = pavgb((char)(uVar6 >> 0x28),uVar7);
  auVar63[7] = pavgb((char)(uVar6 >> 0x30),0);
  auVar63[8] = pavgb(uVar7,0);
  auVar63[9] = pavgb(0,0);
  auVar63[10] = pavgb(0,0);
  auVar63[0xb] = pavgb(0,0);
  auVar63[0xc] = pavgb(0,0);
  auVar63[0xd] = pavgb(0,0);
  auVar63[0xe] = pavgb(0,0);
  auVar63[0xf] = pavgb(0,0);
  auVar64 = psubusb(auVar63,(auVar58 ^ auVar64) & _DAT_001a4960);
  uVar55 = pavgb(auVar64[0],uVar66);
  uVar66 = pavgb(auVar64[1],uVar67);
  uVar67 = pavgb(auVar64[2],uVar34);
  uVar45 = pavgb(auVar64[3],uVar35);
  iVar62 = CONCAT13(uVar45,CONCAT12(uVar67,CONCAT11(uVar66,uVar55)));
  pavgb(auVar64[4],uVar37);
  pavgb(auVar64[5],uVar40);
  pavgb(auVar64[6],uVar46);
  pavgb(auVar64[7],uVar7);
  pavgb(auVar64[8],0);
  pavgb(auVar64[9],0);
  pavgb(auVar64[10],0);
  pavgb(auVar64[0xb],0);
  pavgb(auVar64[0xc],0);
  pavgb(auVar64[0xd],0);
  pavgb(auVar64[0xe],0);
  pavgb(auVar64[0xf],0);
  *(ulong *)(dst + 0x610) = CONCAT44(iVar56,(int)(CONCAT16(uVar39,uVar30) >> 0x18));
  *(ulong *)(dst + 0x630) = CONCAT44(iVar62,(int)((uint6)uVar30 >> 0x10));
  *(ulong *)(dst + 0x650) = CONCAT44(iVar56 << 8,(int)((uint5)uVar29 >> 8));
  *(ulong *)(dst + 0x670) = CONCAT44(iVar62 << 8,uVar28);
  dst[0x654] = (uint8_t)uVar21;
  uVar19 = (uint8_t)(uVar16 + uVar10 + 2 + uVar17 * 2 >> 2);
  dst[0x674] = uVar19;
  uVar6 = *(ulong *)top;
  uVar1 = *(ulong *)top;
  auVar25._0_8_ = uVar1 >> 8;
  auVar25._8_8_ = 0;
  auVar54._8_4_ = (uint)uVar6;
  auVar54._0_8_ = uVar6;
  auVar54._12_4_ = (int)(uVar6 >> 0x20);
  uVar40 = (undefined1)(uVar6 >> 0x10);
  auVar32[0] = pavgb((char)uVar1,uVar40);
  uVar66 = (undefined1)(uVar1 >> 8);
  uVar46 = (undefined1)(uVar6 >> 0x18);
  auVar32[1] = pavgb(uVar66,uVar46);
  uVar67 = (undefined1)(uVar1 >> 0x10);
  uVar48 = (undefined1)(uVar6 >> 0x20);
  auVar32[2] = pavgb(uVar67,uVar48);
  uVar34 = (undefined1)(uVar1 >> 0x18);
  uVar50 = (undefined1)(uVar6 >> 0x28);
  auVar32[3] = pavgb(uVar34,uVar50);
  uVar35 = (undefined1)(uVar1 >> 0x20);
  uVar51 = (undefined1)(uVar6 >> 0x30);
  auVar32[4] = pavgb(uVar35,uVar51);
  uVar49 = (undefined1)(uVar1 >> 0x28);
  uVar52 = (undefined1)(uVar6 >> 0x38);
  auVar32[5] = pavgb(uVar49,uVar52);
  uVar37 = (undefined1)(uVar1 >> 0x30);
  uVar7 = (undefined1)(uVar1 >> 0x38);
  auVar32[6] = pavgb(uVar37,uVar52);
  auVar32[7] = pavgb(uVar7,0);
  auVar32[8] = pavgb(0,0);
  auVar32[9] = pavgb(0,0);
  auVar32[10] = pavgb(0,0);
  auVar32[0xb] = pavgb(0,0);
  auVar32[0xc] = pavgb(0,0);
  auVar32[0xd] = pavgb(0,0);
  auVar32[0xe] = pavgb(0,0);
  auVar32[0xf] = pavgb(0,0);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = (auVar54._8_8_ >> 0x10 | (uVar6 >> 0x38) << 0x30) ^ uVar1;
  auVar64 = psubusb(auVar32,auVar44 & auVar31);
  uVar55 = pavgb(auVar64[0],uVar66);
  uVar39 = pavgb(auVar64[1],uVar67);
  uVar45 = pavgb(auVar64[2],uVar34);
  uVar47 = pavgb(auVar64[3],uVar35);
  uVar28 = CONCAT13(uVar47,CONCAT12(uVar45,CONCAT11(uVar39,uVar55)));
  uVar55 = pavgb(auVar64[4],uVar49);
  uVar29 = CONCAT14(uVar55,uVar28);
  uVar55 = pavgb(auVar64[5],uVar37);
  uVar30 = CONCAT15(uVar55,uVar29);
  uVar55 = pavgb(auVar64[6],uVar7);
  pavgb(auVar64[7],0);
  pavgb(auVar64[8],0);
  pavgb(auVar64[9],0);
  pavgb(auVar64[10],0);
  pavgb(auVar64[0xb],0);
  pavgb(auVar64[0xc],0);
  pavgb(auVar64[0xd],0);
  pavgb(auVar64[0xe],0);
  pavgb(auVar64[0xf],0);
  uVar39 = pavgb((char)uVar1,uVar66);
  uVar45 = pavgb(uVar66,uVar67);
  uVar47 = pavgb(uVar67,uVar34);
  uVar60 = pavgb(uVar34,uVar35);
  uVar57 = CONCAT13(uVar60,CONCAT12(uVar47,CONCAT11(uVar45,uVar39)));
  uVar61 = pavgb(uVar35,uVar49);
  auVar59._0_5_ = CONCAT14(uVar61,uVar57);
  auVar59[5] = pavgb(uVar49,uVar37);
  auVar59[6] = pavgb(uVar37,uVar7);
  auVar59[7] = pavgb(uVar7,0);
  auVar59[8] = pavgb(0,0);
  auVar59[9] = pavgb(0,0);
  auVar59[10] = pavgb(0,0);
  auVar59[0xb] = pavgb(0,0);
  auVar59[0xc] = pavgb(0,0);
  auVar59[0xd] = pavgb(0,0);
  auVar59[0xe] = pavgb(0,0);
  auVar59[0xf] = pavgb(0,0);
  auVar65[0] = pavgb(uVar40,uVar66);
  auVar65[1] = pavgb(uVar46,uVar67);
  auVar65[2] = pavgb(uVar48,uVar34);
  auVar65[3] = pavgb(uVar50,uVar35);
  auVar65[4] = pavgb(uVar51,uVar49);
  auVar65[5] = pavgb(uVar52,uVar37);
  auVar65[6] = pavgb(0,uVar7);
  auVar65[7] = pavgb(0,0);
  auVar65[8] = pavgb(0,0);
  auVar65[9] = pavgb(0,0);
  auVar65[10] = pavgb(0,0);
  auVar65[0xb] = pavgb(0,0);
  auVar65[0xc] = pavgb(0,0);
  auVar65[0xd] = pavgb(0,0);
  auVar65[0xe] = pavgb(0,0);
  auVar65[0xf] = pavgb(0,0);
  auVar68[0] = pavgb(uVar39,auVar65[0]);
  auVar68[1] = pavgb(uVar45,auVar65[1]);
  auVar68[2] = pavgb(uVar47,auVar65[2]);
  auVar68[3] = pavgb(uVar60,auVar65[3]);
  auVar68[4] = pavgb(uVar61,auVar65[4]);
  auVar68[5] = pavgb(auVar59[5],auVar65[5]);
  auVar68[6] = pavgb(auVar59[6],auVar65[6]);
  auVar68[7] = pavgb(auVar59[7],auVar65[7]);
  auVar68[8] = pavgb(auVar59[8],auVar65[8]);
  auVar68[9] = pavgb(auVar59[9],auVar65[9]);
  auVar68[10] = pavgb(auVar59[10],auVar65[10]);
  auVar68[0xb] = pavgb(auVar59[0xb],auVar65[0xb]);
  auVar68[0xc] = pavgb(auVar59[0xc],auVar65[0xc]);
  auVar68[0xd] = pavgb(auVar59[0xd],auVar65[0xd]);
  auVar68[0xe] = pavgb(auVar59[0xe],auVar65[0xe]);
  auVar68[0xf] = pavgb(auVar59[0xf],auVar65[0xf]);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar25._0_8_ ^ uVar1;
  auVar31 = psubusb(auVar68,(auVar26 | auVar54 >> 0x50 ^ auVar25) & (auVar65 ^ auVar59) & auVar31);
  *(ulong *)(dst + 0x618) = CONCAT44(uVar57,uVar28);
  *(ulong *)(dst + 0x638) = CONCAT44(auVar31._0_4_,(int)((uint5)uVar29 >> 8));
  *(ulong *)(dst + 0x658) = CONCAT44((int)((uint5)auVar59._0_5_ >> 8),(int)((uint6)uVar30 >> 0x10));
  *(ulong *)(dst + 0x678) = CONCAT44(auVar31._1_4_,(int)(CONCAT16(uVar55,uVar30) >> 0x18));
  dst[0x65f] = auVar31[4];
  dst[0x67f] = auVar31[5];
  uVar24 = (uint)top[-1];
  bVar3 = top[-5];
  uVar15 = (uint)bVar3;
  uVar23 = (uint)uVar6 & 0xff;
  uVar21 = (uint)(uVar6 >> 8) & 0xff;
  uVar9 = (uint8_t)(uVar16 + uVar24 + 1 >> 1);
  dst[0x6a2] = uVar9;
  dst[0x680] = uVar9;
  uVar18 = (uint8_t)(uVar17 + uVar16 + 1 >> 1);
  dst[0x6c2] = uVar18;
  dst[0x6a0] = uVar18;
  uVar14 = (uint8_t)(uVar17 + uVar10 + 1 >> 1);
  dst[0x6e2] = uVar14;
  dst[0x6c0] = uVar14;
  uVar20 = (uint8_t)(uVar10 + uVar15 + 1 >> 1);
  dst[0x6e0] = uVar20;
  dst[0x683] = (uint8_t)(uVar23 + uVar21 * 2 + ((uint)(uVar6 >> 0x10) & 0xff) + 2 >> 2);
  dst[0x682] = (uint8_t)(uVar24 + uVar23 * 2 + 2 + uVar21 >> 2);
  uVar9 = (uint8_t)(uVar16 + uVar24 * 2 + 2 + uVar23 >> 2);
  dst[0x6a3] = uVar9;
  dst[0x681] = uVar9;
  uVar9 = (uint8_t)(uVar17 + uVar16 * 2 + uVar24 + 2 >> 2);
  dst[0x6c3] = uVar9;
  dst[0x6a1] = uVar9;
  dst[0x6e3] = uVar19;
  dst[0x6c1] = uVar19;
  uVar9 = (uint8_t)(iVar13 + uVar15 >> 2);
  dst[0x6e1] = uVar9;
  dst[0x684] = uVar18;
  dst[0x6a4] = uVar14;
  dst[0x686] = uVar14;
  dst[0x6c4] = uVar20;
  dst[0x6a6] = uVar20;
  dst[0x685] = (uint8_t)uVar22;
  dst[0x6a5] = uVar9;
  dst[0x687] = uVar9;
  uVar9 = (uint8_t)(uVar10 + uVar15 * 3 + 2 >> 2);
  dst[0x6c5] = uVar9;
  dst[0x6a7] = uVar9;
  auVar31 = pshuflw(ZEXT216(CONCAT11(bVar3,bVar3)),ZEXT216(CONCAT11(bVar3,bVar3)),0);
  *(int *)(dst + 0x6e4) = auVar31._0_4_;
  dst[0x6c6] = bVar3;
  dst[0x6c7] = bVar3;
  return;
}

Assistant:

static void Intra4Preds_SSE2(uint8_t* WEBP_RESTRICT dst,
                             const uint8_t* WEBP_RESTRICT top) {
  DC4_SSE2(I4DC4 + dst, top);
  TM4_SSE2(I4TM4 + dst, top);
  VE4_SSE2(I4VE4 + dst, top);
  HE4_SSE2(I4HE4 + dst, top);
  RD4_SSE2(I4RD4 + dst, top);
  VR4_SSE2(I4VR4 + dst, top);
  LD4_SSE2(I4LD4 + dst, top);
  VL4_SSE2(I4VL4 + dst, top);
  HD4_SSE2(I4HD4 + dst, top);
  HU4_SSE2(I4HU4 + dst, top);
}